

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

void varianceFilter(Mat *image,int l)

{
  int iVar1;
  _InputArray *p_Var2;
  _InputArray local_4d0;
  undefined8 local_4b8;
  int local_4b0;
  int local_4ac;
  undefined8 local_4a8;
  int local_4a0;
  int local_49c;
  _OutputArray local_498;
  undefined4 local_480;
  Mat *local_478;
  undefined8 local_470;
  Mat sigma;
  Mat sqrs;
  _InputArray local_3a8 [14];
  Mat mean;
  Mat image32f;
  _InputArray local_188 [14];
  
  cv::Mat::Mat(&image32f);
  local_3a8[0].sz.width = 0;
  local_3a8[0].sz.height = 0;
  local_3a8[0].flags = 0x2010000;
  local_3a8[0].obj = &image32f;
  cv::Mat::convertTo((_OutputArray *)image,(int)local_3a8,1.0,0.0);
  cv::Mat::Mat(&mean);
  local_3a8[0].sz.width = 0;
  local_3a8[0].sz.height = 0;
  local_188[0].sz.width = 0;
  local_188[0].sz.height = 0;
  local_3a8[0].flags = 0x1010000;
  local_188[0].flags = 0x2010000;
  iVar1 = l * 2 + 1;
  local_4a8 = 0xffffffffffffffff;
  local_4a0 = iVar1;
  local_49c = iVar1;
  local_3a8[0].obj = &image32f;
  local_188[0].obj = &mean;
  cv::blur();
  cv::Mat::Mat(&sqrs);
  _sigma = 0x1010000;
  cv::Mat::mul(local_3a8,1.0);
  cv::_InputArray::_InputArray(local_188,(MatExpr *)local_3a8);
  local_4d0.sz.width = 0;
  local_4d0.sz.height = 0;
  local_4d0.flags = 0x2010000;
  local_4b8 = 0xffffffffffffffff;
  local_4d0.obj = &sqrs;
  local_4b0 = iVar1;
  local_4ac = iVar1;
  cv::blur(local_188);
  cv::MatExpr::~MatExpr((MatExpr *)local_3a8);
  cv::Mat::Mat(&sigma);
  local_470 = 0;
  local_480 = 0x1010000;
  local_478 = &mean;
  cv::Mat::mul(local_188,1.0);
  cv::operator-((Mat *)local_3a8,(MatExpr *)&sqrs);
  cv::_InputArray::_InputArray(&local_4d0,(MatExpr *)local_3a8);
  local_498.super__InputArray.sz.width = 0;
  local_498.super__InputArray.sz.height = 0;
  local_498.super__InputArray.flags = 0x2010000;
  local_498.super__InputArray.obj = &sigma;
  cv::sqrt(&local_4d0,&local_498);
  cv::MatExpr::~MatExpr((MatExpr *)local_3a8);
  cv::MatExpr::~MatExpr((MatExpr *)local_188);
  local_3a8[0].sz.width = 0;
  local_3a8[0].sz.height = 0;
  local_188[0].sz.width = 0;
  local_188[0].sz.height = 0;
  local_3a8[0].flags = 0x1010000;
  local_188[0].flags = 0x3010000;
  local_3a8[0].obj = &sigma;
  local_188[0].obj = image;
  p_Var2 = (_InputArray *)cv::noArray();
  cv::normalize(local_3a8,(_InputOutputArray *)local_188,0.0,255.0,0x20,-1,p_Var2);
  local_3a8[0].sz.width = 0;
  local_3a8[0].sz.height = 0;
  local_3a8[0].flags = 0x2010000;
  local_3a8[0].obj = image;
  cv::Mat::convertTo((_OutputArray *)image,(int)local_3a8,1.0,0.0);
  cv::Mat::~Mat(&sigma);
  cv::Mat::~Mat(&sqrs);
  cv::Mat::~Mat(&mean);
  cv::Mat::~Mat(&image32f);
  return;
}

Assistant:

void varianceFilter(cv::Mat & image, int l) {
    cv::Mat image32f;
    image.convertTo(image32f, CV_32F);

    cv::Mat mean;
    cv::blur(image32f, mean, cv::Size(l*2+1, l*2+1));

    cv::Mat sqrs;
    cv::blur(image32f.mul(image32f), sqrs, cv::Size(l*2+1, l*2+1));

    cv::Mat sigma;
    cv::sqrt(sqrs - mean.mul(mean), sigma);

    cv::normalize(sigma, image, 0.0, 255.0, cv::NORM_MINMAX);
    image.convertTo(image, CV_8UC1);
}